

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O0

Aig_Man_t *
Dar_ManChoice(Aig_Man_t *pAig,int fBalance,int fUpdateLevel,int fConstruct,int nConfMax,
             int nLevelMax,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Vec_Ptr_t *p;
  void *Entry;
  void *Entry_00;
  abctime aVar3;
  Aig_Man_t *p_00;
  abctime clk;
  int i;
  Vec_Ptr_t *vAigs;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  int nLevelMax_local;
  int nConfMax_local;
  int fConstruct_local;
  int fUpdateLevel_local;
  int fBalance_local;
  Aig_Man_t *pAig_local;
  
  aVar2 = Abc_Clock();
  p = Dar_ManChoiceSynthesis(pAig,fBalance,fUpdateLevel,0,fVerbose);
  if (fConstruct == 0) {
    Entry = Vec_PtrPop(p);
    Entry_00 = Vec_PtrEntry(p,0);
    Vec_PtrPush(p,Entry_00);
    Vec_PtrWriteEntry(p,0,Entry);
  }
  if (fVerbose != 0) {
    Abc_Print(1,"%s =","Synthesis time");
    aVar3 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar2) * 1.0) / 1000000.0);
  }
  aVar2 = Abc_Clock();
  if (fConstruct == 0) {
    pTemp = Aig_ManChoicePartitioned(p,300,nConfMax,nLevelMax,fVerbose);
  }
  else {
    pTemp = Aig_ManChoiceConstructive(p,fVerbose);
  }
  for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1) {
    p_00 = (Aig_Man_t *)Vec_PtrEntry(p,clk._4_4_);
    Aig_ManStop(p_00);
  }
  Vec_PtrFree(p);
  if (fVerbose != 0) {
    Abc_Print(1,"%s =","Choicing time ");
    aVar3 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar2) * 1.0) / 1000000.0);
  }
  return pTemp;
}

Assistant:

Aig_Man_t * Dar_ManChoice( Aig_Man_t * pAig, int fBalance, int fUpdateLevel, int fConstruct, int nConfMax, int nLevelMax, int fVerbose )
{
    Aig_Man_t * pMan, * pTemp;
    Vec_Ptr_t * vAigs;
    int i;
    abctime clk;

clk = Abc_Clock();
//    vAigs = Dar_ManChoiceSynthesisExt();
    vAigs = Dar_ManChoiceSynthesis( pAig, fBalance, fUpdateLevel, 0, fVerbose );

    // swap the first and last network
    // this should lead to the primary choice being "better" because of synthesis
    // (it is also important when constructing choices)
    if ( !fConstruct )
    {
        pMan = (Aig_Man_t *)Vec_PtrPop( vAigs );
        Vec_PtrPush( vAigs, Vec_PtrEntry(vAigs,0) );
        Vec_PtrWriteEntry( vAigs, 0, pMan );
    }

if ( fVerbose )
{
ABC_PRT( "Synthesis time", Abc_Clock() - clk );
}
clk = Abc_Clock();
    if ( fConstruct )
        pMan = Aig_ManChoiceConstructive( vAigs, fVerbose );
    else
        pMan = Aig_ManChoicePartitioned( vAigs, 300, nConfMax, nLevelMax, fVerbose );
    Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, i )
        Aig_ManStop( pTemp );
    Vec_PtrFree( vAigs );
if ( fVerbose )
{
ABC_PRT( "Choicing time ", Abc_Clock() - clk );
}
    return pMan;
//    return NULL;
}